

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

int IoCommandReadPla(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  char *pcVar2;
  Abc_Ntk_t *pTemp;
  int fCheck;
  int fBoth;
  int fZeros;
  int c;
  char *pFileName;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fCheck = 0;
  pTemp._4_4_ = 0;
  pTemp._0_4_ = 1;
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"zbch"), iVar1 != -1) {
    switch(iVar1) {
    case 0x62:
      pTemp._4_4_ = pTemp._4_4_ ^ 1;
      break;
    case 99:
      pTemp._0_4_ = (uint)pTemp ^ 1;
      break;
    default:
      goto LAB_00338705;
    case 0x68:
      goto LAB_00338705;
    case 0x7a:
      fCheck = fCheck ^ 1;
    }
  }
  if (argc == globalUtilOptind + 1) {
    if ((fCheck == 0) && (pTemp._4_4_ == 0)) {
      pFileName = (char *)Io_Read(argv[globalUtilOptind],IO_FILE_PLA,(uint)pTemp,0);
    }
    else {
      pNtk_00 = Io_ReadPla(argv[globalUtilOptind],fCheck,pTemp._4_4_,(uint)pTemp);
      if (pNtk_00 == (Abc_Ntk_t *)0x0) {
        printf("Reading PLA file has failed.\n");
        return 1;
      }
      pFileName = (char *)Abc_NtkToLogic(pNtk_00);
      Abc_NtkDelete(pNtk_00);
    }
    if (pFileName == (char *)0x0) {
      pAbc_local._4_4_ = 1;
    }
    else {
      Abc_FrameReplaceCurrentNetwork(pAbc,(Abc_Ntk_t *)pFileName);
      Abc_FrameClearVerifStatus(pAbc);
      pAbc_local._4_4_ = 0;
    }
  }
  else {
LAB_00338705:
    fprintf((FILE *)pAbc->Err,"usage: read_pla [-zbch] <file>\n");
    fprintf((FILE *)pAbc->Err,"\t         reads the network in PLA\n");
    pcVar2 = "on-set";
    if (fCheck != 0) {
      pcVar2 = "off-set";
    }
    fprintf((FILE *)pAbc->Err,"\t-z     : toggle reading on-set and off-set [default = %s]\n",pcVar2
           );
    pcVar2 = "on-set";
    if (pTemp._4_4_ != 0) {
      pcVar2 = "off-set";
    }
    fprintf((FILE *)pAbc->Err,
            "\t-b     : toggle reading both on-set and off-set as on-set [default = %s]\n",pcVar2);
    pcVar2 = "no";
    if ((uint)pTemp != 0) {
      pcVar2 = "yes";
    }
    fprintf((FILE *)pAbc->Err,"\t-c     : toggle network check after reading [default = %s]\n",
            pcVar2);
    fprintf((FILE *)pAbc->Err,"\t-h     : prints the command summary\n");
    fprintf((FILE *)pAbc->Err,"\tfile   : the name of a file to read\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int IoCommandReadPla( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk;
    char * pFileName;
    int c, fZeros = 0, fBoth = 0, fCheck = 1;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "zbch" ) ) != EOF )
    {
        switch ( c )
        {
            case 'z':
                fZeros ^= 1;
                break;
            case 'b':
                fBoth ^= 1;
                break;
            case 'c':
                fCheck ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the input file name
    pFileName = argv[globalUtilOptind];
    // read the file using the corresponding file reader
    if ( fZeros || fBoth )
    {
        Abc_Ntk_t * pTemp;
        pNtk = Io_ReadPla( pFileName, fZeros, fBoth, fCheck );
        if ( pNtk == NULL )
        {
            printf( "Reading PLA file has failed.\n" );
            return 1;
        }
        pNtk = Abc_NtkToLogic( pTemp = pNtk );
        Abc_NtkDelete( pTemp );
    }
    else
        pNtk = Io_Read( pFileName, IO_FILE_PLA, fCheck, 0 );
    if ( pNtk == NULL )
        return 1;
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtk );
    Abc_FrameClearVerifStatus( pAbc );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: read_pla [-zbch] <file>\n" );
    fprintf( pAbc->Err, "\t         reads the network in PLA\n" );
    fprintf( pAbc->Err, "\t-z     : toggle reading on-set and off-set [default = %s]\n", fZeros? "off-set":"on-set" );
    fprintf( pAbc->Err, "\t-b     : toggle reading both on-set and off-set as on-set [default = %s]\n", fBoth? "off-set":"on-set" );
    fprintf( pAbc->Err, "\t-c     : toggle network check after reading [default = %s]\n", fCheck? "yes":"no" );
    fprintf( pAbc->Err, "\t-h     : prints the command summary\n" );
    fprintf( pAbc->Err, "\tfile   : the name of a file to read\n" );
    return 1;
}